

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O0

boolean hits_bars(obj **obj_p,int x,int y,int dx,int dy,int always_hit,int whodidit)

{
  char cVar1;
  obj *poVar2;
  int iVar3;
  bool local_4b;
  bool local_4a;
  bool local_49;
  bool local_35;
  int oskill;
  boolean hits;
  int obj_type;
  obj *otmp;
  int always_hit_local;
  int dy_local;
  int dx_local;
  int y_local;
  int x_local;
  obj **obj_p_local;
  
  poVar2 = *obj_p;
  iVar3 = (int)poVar2->otyp;
  local_35 = SUB41(always_hit,0);
  if (local_35 == false) {
    switch(poVar2->oclass) {
    case '\x02':
      cVar1 = objects[iVar3].oc_subtyp;
      local_49 = false;
      if (((cVar1 != -0x16) && (local_49 = false, cVar1 != -0x18)) &&
         ((local_49 = false, cVar1 != -0x19 &&
          (((local_49 = false, cVar1 != -0x1a && (local_49 = false, cVar1 != '\x12')) &&
           (local_49 = false, cVar1 != '\x13')))))) {
        local_49 = cVar1 != '\x02';
      }
      local_35 = local_49;
      break;
    case '\x03':
      local_35 = objects[iVar3].oc_subtyp != '\x03';
      break;
    default:
      break;
    case '\x06':
      local_4a = false;
      if ((((iVar3 != 0xe2) && (local_4a = false, iVar3 != 0xe3)) &&
          (local_4a = false, iVar3 != 0xe4)) &&
         (((local_4a = false, iVar3 != 0xe5 && (local_4a = false, iVar3 != 0xe6)) &&
          ((local_4a = false, iVar3 != 0xed && (local_4a = false, iVar3 != 0xfa)))))) {
        local_4a = iVar3 != 0xfb;
      }
      local_35 = local_4a;
      break;
    case '\a':
      if ((iVar3 == 0x10e) && (mons[poVar2->corpsenm].msize != '\0')) {
        local_35 = true;
      }
      else {
        local_4b = iVar3 == 0x111 || iVar3 == 0x112;
        local_35 = local_4b;
      }
      break;
    case '\n':
    case '\v':
    case '\x0f':
    case '\x10':
      local_35 = true;
      break;
    case '\x0e':
      if ((iVar3 != 0x215) || (mons[poVar2->corpsenm].msize != '\0')) {
        local_35 = true;
      }
    }
  }
  if ((local_35 != false) && (whodidit != -1)) {
    hit_bars(obj_p,x,y,x + dx,y + dy,whodidit != 0,'\0');
  }
  return local_35;
}

Assistant:

boolean hits_bars(struct obj **obj_p,	/* *obj_p will be set to NULL if object breaks */
		  int x, int y, int dx, int dy,
		  int always_hit,	/* caller can force a hit for items which would fit through */
		  int whodidit)	/* 1==hero, 0=other, -1==just check whether it'll pass thru */
{
    struct obj *otmp = *obj_p;
    int obj_type = otmp->otyp;
    boolean hits = always_hit;

    if (!hits)
	switch (otmp->oclass) {
	case WEAPON_CLASS:
	    {
		int oskill = objects[obj_type].oc_skill;

		hits = (oskill != -P_BOW  && oskill != -P_CROSSBOW &&
			oskill != -P_DART && oskill != -P_SHURIKEN &&
			oskill != P_SPEAR && oskill != P_JAVELIN &&
			oskill != P_KNIFE);	/* but not dagger */
		break;
	    }
	case ARMOR_CLASS:
		hits = (objects[obj_type].oc_armcat != ARM_GLOVES);
		break;
	case TOOL_CLASS:
		hits = (obj_type != SKELETON_KEY &&
			obj_type != LOCK_PICK &&
			obj_type != CREDIT_CARD &&
			obj_type != TALLOW_CANDLE &&
			obj_type != WAX_CANDLE &&
			obj_type != LENSES &&
			obj_type != TIN_WHISTLE &&
			obj_type != MAGIC_WHISTLE);
		break;
	case ROCK_CLASS:	/* includes boulder */
		if (obj_type != STATUE ||
			mons[otmp->corpsenm].msize > MZ_TINY) hits = TRUE;
		break;
	case FOOD_CLASS:
		if (obj_type == CORPSE &&
			mons[otmp->corpsenm].msize > MZ_TINY) hits = TRUE;
		else
		    hits = (obj_type == MEAT_STICK ||
			    obj_type == HUGE_CHUNK_OF_MEAT);
		break;
	case SPBOOK_CLASS:
	case WAND_CLASS:
	case BALL_CLASS:
	case CHAIN_CLASS:
		hits = TRUE;
		break;
	default:
		break;
	}

    if (hits && whodidit != -1) {
	hit_bars(obj_p, x, y, x + dx, y + dy, !!whodidit, FALSE);
    }

    return hits;
}